

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  uchar *puVar2;
  long in_FS_OFFSET;
  printbuffer local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.depth = 0;
  if (-1 < prebuffer) {
    local_60.buffer = (uchar *)(*global_hooks.allocate)((ulong)(uint)prebuffer);
    if (local_60.buffer != (uchar *)0x0) {
      local_60.offset = 0;
      local_60.noalloc = 0;
      local_60.hooks.allocate = global_hooks.allocate;
      local_60.hooks.deallocate = global_hooks.deallocate;
      local_60.hooks.reallocate = global_hooks.reallocate;
      local_60.length = (ulong)(uint)prebuffer;
      local_60.format = fmt;
      cVar1 = print_value(item,&local_60);
      puVar2 = local_60.buffer;
      if (cVar1 != 0) goto LAB_00102a9b;
    }
  }
  puVar2 = (uchar *)0x0;
LAB_00102a9b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (char *)puVar2;
}

Assistant:

CJSON_PUBLIC(char *) cJSON_PrintBuffered(const cJSON *item, int prebuffer, cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (prebuffer < 0)
    {
        return NULL;
    }

    p.buffer = (unsigned char*)global_hooks.allocate((size_t)prebuffer);
    if (!p.buffer)
    {
        return NULL;
    }

    p.length = (size_t)prebuffer;
    p.offset = 0;
    p.noalloc = false;
    p.format = fmt;
    p.hooks = global_hooks;

    if (!print_value(item, &p))
    {
        return NULL;
    }

    return (char*)p.buffer;
}